

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

char * __thiscall Fl_Help_View::get_attr(Fl_Help_View *this,char *p,char *n,char *buf,int bufsize)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  char name [255];
  byte local_138 [264];
  
  *buf = '\0';
  bVar3 = *p;
  while( true ) {
    if (bVar3 == 0) {
      return (char *)0x0;
    }
    if (bVar3 == 0x3e) {
      return (char *)0x0;
    }
    p = (char *)((byte *)p + -1);
    do {
      bVar3 = ((byte *)p)[1];
      p = (char *)((byte *)p + 1);
      iVar2 = isspace((uint)bVar3);
    } while (iVar2 != 0);
    if (bVar3 == 0) {
      return (char *)0x0;
    }
    if (bVar3 == 0x3e) {
      return (char *)0x0;
    }
    lVar5 = 0;
    while (((bVar3 != 0 && (iVar2 = isspace((uint)bVar3), 1 < (byte)(bVar3 - 0x3d))) && (iVar2 == 0)
           )) {
      if (lVar5 < 0xfe) {
        local_138[lVar5] = bVar3;
        lVar5 = lVar5 + 1;
      }
      bVar3 = ((byte *)p)[1];
      p = (char *)((byte *)p + 1);
    }
    local_138[lVar5] = 0;
    bVar3 = *p;
    iVar2 = isspace((uint)bVar3);
    pbVar6 = (byte *)buf;
    if (((iVar2 == 0) && (bVar3 != 0)) && (bVar3 != 0x3e)) break;
LAB_001b0b67:
    *pbVar6 = 0;
    iVar2 = strcasecmp(n,(char *)local_138);
    if (iVar2 == 0) {
      return buf;
    }
    *buf = '\0';
    bVar3 = *p;
    if (bVar3 == 0x3e) {
      return (char *)0x0;
    }
  }
  p = (char *)((byte *)p + (bVar3 == 0x3d));
LAB_001b0bae:
  do {
    do {
      bVar3 = *p;
      if (bVar3 == 0) goto LAB_001b0b67;
      uVar4 = (uint)bVar3;
      iVar2 = isspace(uVar4);
      if ((bVar3 == 0x3e) || (iVar2 != 0)) goto LAB_001b0b67;
      if ((uVar4 == 0x27) || (uVar4 == 0x22)) {
        do {
          pbVar7 = (byte *)p;
          do {
            p = (char *)(pbVar7 + 1);
            bVar1 = *p;
            if ((bVar1 == 0) || (bVar1 == bVar3)) {
              if (bVar1 == bVar3) {
                p = (char *)(pbVar7 + 2);
              }
              goto LAB_001b0bae;
            }
            pbVar7 = (byte *)p;
          } while ((long)bufsize <= (long)(pbVar6 + (1 - (long)buf)));
          *pbVar6 = bVar1;
          pbVar6 = pbVar6 + 1;
        } while( true );
      }
      p = (char *)((byte *)p + 1);
    } while ((long)bufsize <= (long)(pbVar6 + (1 - (long)buf)));
    *pbVar6 = bVar3;
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

const char *					// O - Pointer to buf or NULL
Fl_Help_View::get_attr(const char *p,		// I - Pointer to start of attributes
                      const char *n,		// I - Name of attribute
		      char       *buf,		// O - Buffer for attribute value
		      int        bufsize)	// I - Size of buffer
{
  char	name[255],				// Name from string
	*ptr,					// Pointer into name or value
	quote;					// Quote


  buf[0] = '\0';

  while (*p && *p != '>')
  {
    while (isspace((*p)&255))
      p ++;

    if (*p == '>' || !*p)
      return (NULL);

    for (ptr = name; *p && !isspace((*p)&255) && *p != '=' && *p != '>';)
      if (ptr < (name + sizeof(name) - 1))
        *ptr++ = *p++;
      else
        p ++;

    *ptr = '\0';

    if (isspace((*p)&255) || !*p || *p == '>')
      buf[0] = '\0';
    else
    {
      if (*p == '=')
        p ++;

      for (ptr = buf; *p && !isspace((*p)&255) && *p != '>';)
        if (*p == '\'' || *p == '\"')
	{
	  quote = *p++;

	  while (*p && *p != quote)
	    if ((ptr - buf + 1) < bufsize)
	      *ptr++ = *p++;
	    else
	      p ++;

          if (*p == quote)
	    p ++;
	}
	else if ((ptr - buf + 1) < bufsize)
	  *ptr++ = *p++;
	else
	  p ++;

      *ptr = '\0';
    }

    if (strcasecmp(n, name) == 0)
      return (buf);
    else
      buf[0] = '\0';

    if (*p == '>')
      return (NULL);
  }

  return (NULL);
}